

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptString::PadCore
          (ArgumentReader *args,JavascriptString *mainString,bool isPadStart,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ulong uVar6;
  Var pvVar7;
  JavascriptString *pJVar8;
  JavascriptString *pstLeft;
  charcount_t length;
  Type TVar9;
  
  if (mainString == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x85d,"(mainString != nullptr)","mainString != nullptr");
    if (!bVar2) goto LAB_00bbfdb6;
    *puVar5 = 0;
  }
  uVar6 = (ulong)(args->super_Arguments).Info & 0xffffff;
  uVar3 = (uint)uVar6;
  if (uVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x85e,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar2) goto LAB_00bbfdb6;
    *puVar5 = 0;
    uVar3 = SUB84((args->super_Arguments).Info,0) & 0xffffff;
  }
  if (uVar3 != 1) {
    pvVar7 = Arguments::operator[](&args->super_Arguments,1);
    uVar6 = JavascriptConversion::ToLength(pvVar7,scriptContext);
    uVar3 = mainString->m_charLength;
    if ((long)(ulong)uVar3 < (long)uVar6) {
      if ((*(uint *)&(args->super_Arguments).Info & 0xffffff) < 3) {
        pJVar8 = (JavascriptString *)0x0;
      }
      else {
        pvVar7 = Arguments::operator[](&args->super_Arguments,2);
        BVar4 = JavascriptOperators::IsUndefinedObject(pvVar7);
        if (BVar4 == 0) {
          pvVar7 = Arguments::operator[](&args->super_Arguments,2);
          pJVar8 = JavascriptConversion::ToString(pvVar7,scriptContext);
          if (pJVar8->m_charLength == 0) {
            return mainString;
          }
        }
        else {
          pJVar8 = (JavascriptString *)0x0;
        }
      }
      if (0x7ffffffe < uVar6) {
        JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9da,(PCWSTR)0x0);
      }
      if (pJVar8 == (JavascriptString *)0x0) {
        pJVar8 = NewWithBufferT<Js::LiteralString,false>(L" ",1,scriptContext);
      }
      TVar9 = pJVar8->m_charLength;
      if (TVar9 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0x884,"(fillerString->GetLength() > 0)",
                                    "fillerString->GetLength() > 0");
        if (!bVar2) {
LAB_00bbfdb6:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        TVar9 = pJVar8->m_charLength;
      }
      length = (int)uVar6 - uVar3;
      pstLeft = JavascriptLibrary::GetEmptyString
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      if (TVar9 <= length) {
        pstLeft = RepeatCore(pJVar8,length / TVar9,scriptContext);
        length = length - (length / TVar9) * pJVar8->m_charLength;
      }
      if (length != 0) {
        pJVar8 = SubString::New(pJVar8,0,length);
        pstLeft = Concat(pstLeft,pJVar8);
      }
      pJVar8 = pstLeft;
      if (isPadStart) {
        pJVar8 = mainString;
        mainString = pstLeft;
      }
      pJVar8 = Concat(mainString,pJVar8);
      return pJVar8;
    }
  }
  return mainString;
}

Assistant:

JavascriptString* JavascriptString::PadCore(ArgumentReader& args, JavascriptString *mainString, bool isPadStart, ScriptContext* scriptContext)
    {
        Assert(mainString != nullptr);
        Assert(args.Info.Count > 0);

        if (args.Info.Count == 1)
        {
            return mainString;
        }

        int64 maxLength = JavascriptConversion::ToLength(args[1], scriptContext);
        charcount_t currentLength = mainString->GetLength();
        if (maxLength <= currentLength)
        {
            return mainString;
        }

        JavascriptString * fillerString = nullptr;
        if (args.Info.Count > 2 && !JavascriptOperators::IsUndefinedObject(args[2]))
        {
            JavascriptString *argStr = JavascriptConversion::ToString(args[2], scriptContext);
            if (argStr->GetLength() > 0)
            {
                fillerString = argStr;
            }
            else
            {
                return mainString;
            }
        }

        if (maxLength > JavascriptString::MaxCharLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfBoundString);
        }

        if (fillerString == nullptr)
        {
            fillerString = NewWithBuffer(_u(" "), 1, scriptContext);
        }

        Assert(fillerString->GetLength() > 0);

        charcount_t fillLength = (charcount_t)(maxLength - currentLength);
        charcount_t count = fillLength / fillerString->GetLength();
        JavascriptString * finalPad = scriptContext->GetLibrary()->GetEmptyString();
        if (count > 0)
        {
            finalPad = RepeatCore(fillerString, count, scriptContext);
            fillLength -= (count * fillerString->GetLength());
        }

        if (fillLength > 0)
        {
            finalPad = Concat(finalPad, SubString::New(fillerString, 0, fillLength));
        }

        return isPadStart ? Concat(finalPad, mainString) : Concat(mainString, finalPad);
    }